

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spvIR.h
# Opt level: O3

void __thiscall spv::Builder::setAccessChainLValue(Builder *this,Id lValue)

{
  pointer ppIVar1;
  Instruction *pIVar2;
  ulong uVar3;
  
  ppIVar1 = (this->module).idToInstruction.
            super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pIVar2 = ppIVar1[lValue];
  if (pIVar2 == (Instruction *)0x0) {
    uVar3 = 0;
  }
  else {
    uVar3 = (ulong)pIVar2->typeId;
  }
  if (ppIVar1[uVar3]->opCode == OpTypePointer) {
    (this->accessChain).base = lValue;
    return;
  }
  __assert_fail("isPointer(lValue)",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.h"
                ,0x32e,"void spv::Builder::setAccessChainLValue(Id)");
}

Assistant:

spv::Id getTypeId(Id resultId) const {
        return idToInstruction[resultId] == nullptr ? NoType : idToInstruction[resultId]->getTypeId();
    }